

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gme_File.cpp
# Opt level: O1

blargg_err_t __thiscall Gme_File::load_(Gme_File *this,Data_Reader *in)

{
  int iVar1;
  undefined4 extraout_var;
  uchar *puVar2;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  char *pcVar3;
  size_t __size;
  
  iVar1 = (*in->_vptr_Data_Reader[4])(in);
  __size = CONCAT44(extraout_var,iVar1);
  puVar2 = (uchar *)realloc((this->file_data).begin_,__size);
  if (__size == 0 || puVar2 != (uchar *)0x0) {
    (this->file_data).begin_ = puVar2;
    (this->file_data).size_ = __size;
    iVar1 = (*in->_vptr_Data_Reader[3])(in,(this->file_data).begin_,(this->file_data).size_);
    pcVar3 = (char *)CONCAT44(extraout_var_00,iVar1);
    if (pcVar3 == (blargg_err_t)0x0) {
      iVar1 = (*this->_vptr_Gme_File[4])(this,(this->file_data).begin_,(this->file_data).size_);
      return (blargg_err_t)CONCAT44(extraout_var_01,iVar1);
    }
  }
  else {
    pcVar3 = "Out of memory";
  }
  return pcVar3;
}

Assistant:

blargg_err_t Gme_File::load_( Data_Reader& in )
{
	RETURN_ERR( file_data.resize( in.remain() ) );
	RETURN_ERR( in.read( file_data.begin(), (long)file_data.size() ) );
	return load_mem_( file_data.begin(), (long)file_data.size() );
}